

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O2

string_type * __thiscall
booster::locale::impl_icu::converter_impl<char>::convert_abi_cxx11_
          (string_type *__return_storage_ptr__,converter_impl<char> *this,conversion_type how,
          char_type *begin,char_type *end,int flags)

{
  UnicodeString str;
  icu_std_converter<char,_1> cvt;
  icu_std_converter<char,_1> local_c0;
  undefined1 local_80 [48];
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)&this->encoding_);
  icu_std_converter<char,_1>::icu_std_converter
            ((icu_std_converter<char,_1> *)local_80,&local_50,cvt_skip);
  std::__cxx11::string::~string((string *)&local_50);
  icu_std_converter<char,_1>::icu(&local_c0,local_80,begin);
  switch(how) {
  case normalization:
    anon_unknown_11::normalize_string((UnicodeString *)&local_c0,flags);
    break;
  case upper_case:
    icu_70::UnicodeString::toUpper((Locale *)&local_c0);
    break;
  case lower_case:
    icu_70::UnicodeString::toLower((Locale *)&local_c0);
    break;
  case case_folding:
    icu_70::UnicodeString::foldCase((uint)&local_c0);
    break;
  case title_case:
    icu_70::UnicodeString::toTitle((BreakIterator *)&local_c0,(Locale *)0x0);
  }
  icu_std_converter<char,1>::std_abi_cxx11_
            (__return_storage_ptr__,local_80,(UnicodeString *)&local_c0);
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_c0);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  return __return_storage_ptr__;
}

Assistant:

virtual string_type convert(converter_base::conversion_type how,char_type const *begin,char_type const *end,int flags = 0) const
        {
            icu_std_converter<char_type> cvt(encoding_);
            icu::UnicodeString str=cvt.icu(begin,end);
            switch(how) {
            case converter_base::normalization:
                normalize_string(str,flags);
                break;
            case converter_base::upper_case:
                str.toUpper(locale_);
                break;
            case converter_base::lower_case:
                str.toLower(locale_);
                break;
            case converter_base::title_case:
                str.toTitle(0,locale_);
                break;
            case converter_base::case_folding:
                str.foldCase();
                break;
            default:
                ;
            }
            return cvt.std(str);
        }